

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.cpp
# Opt level: O2

void __thiscall glslang::TVariable::dump(TVariable *this,TInfoSink *infoSink,bool complete)

{
  TInfoSinkBase *this_00;
  TString name;
  int iVar1;
  undefined4 extraout_var;
  pool_allocator<char> pVar2;
  pool_allocator<char> pVar3;
  char *s;
  undefined7 in_register_00000011;
  undefined8 in_stack_ffffffffffffff58;
  TString in_stack_ffffffffffffff60;
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> local_58 [40];
  
  this_00 = &infoSink->debug;
  iVar1 = (*(this->super_TSymbol)._vptr_TSymbol[3])();
  TInfoSinkBase::append(this_00,*(char **)(CONCAT44(extraout_var,iVar1) + 8));
  TInfoSinkBase::append(this_00,": ");
  if ((int)CONCAT71(in_register_00000011,complete) == 0) {
    s = TType::getStorageQualifierString(&this->type);
    TInfoSinkBase::append(this_00,s);
    TInfoSinkBase::append(this_00," ");
    TType::getBasicTypeString_abi_cxx11_((TString *)&stack0xffffffffffffff80,&this->type);
    TInfoSinkBase::append(this_00,(TString *)&stack0xffffffffffffff80);
    if ((this->type).arraySizes != (TArraySizes *)0x0) {
      TInfoSinkBase::append(this_00,"[0]");
    }
  }
  else {
    pVar2.allocator = GetThreadPoolAllocator();
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    basic_string<glslang::std::allocator<char>>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
               &stack0xffffffffffffff58,"",(pool_allocator<char> *)&stack0xffffffffffffff50);
    pVar3.allocator = GetThreadPoolAllocator();
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    basic_string<glslang::std::allocator<char>>
              (local_58,"",(pool_allocator<char> *)&stack0xffffffffffffff48);
    name._M_dataplus._M_p = (pointer)local_58;
    name._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)&stack0xffffffffffffff58;
    name._M_string_length = (size_type)pVar3.allocator;
    name.field_2._M_allocated_capacity = (size_type)pVar2.allocator;
    name.field_2._8_8_ = in_stack_ffffffffffffff58;
    TType::getCompleteString
              ((TString *)&stack0xffffffffffffff80,&this->type,false,true,true,true,name,
               in_stack_ffffffffffffff60);
    TInfoSinkBase::append(this_00,(TString *)&stack0xffffffffffffff80);
    TSymbol::dumpExtensions(&this->super_TSymbol,infoSink);
  }
  TInfoSinkBase::append(this_00,"\n");
  return;
}

Assistant:

void TVariable::dump(TInfoSink& infoSink, bool complete) const
{
    if (complete) {
        infoSink.debug << getName().c_str() << ": " << type.getCompleteString();
        dumpExtensions(infoSink);
    } else {
        infoSink.debug << getName().c_str() << ": " << type.getStorageQualifierString() << " "
                       << type.getBasicTypeString();

        if (type.isArray())
            infoSink.debug << "[0]";
    }

    infoSink.debug << "\n";
}